

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  Tables *pTVar1;
  Symbol symbol;
  Descriptor *pDVar2;
  Descriptor *proto_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int32 iVar6;
  int32 iVar7;
  int iVar8;
  ulong uVar9;
  string *psVar10;
  OneofDescriptorProto *proto_01;
  FieldDescriptorProto *pFVar11;
  DescriptorProto *proto_02;
  EnumDescriptorProto *proto_03;
  DescriptorProto_ExtensionRange *pDVar12;
  DescriptorProto_ReservedRange *pDVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar14;
  MessageOptions *orig_options;
  string *psVar15;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar16;
  SubstituteArg *in_stack_ffffffffffffee68;
  string *local_f98;
  SubstituteArg local_f88;
  SubstituteArg local_f58;
  SubstituteArg local_f28;
  SubstituteArg local_ef8;
  SubstituteArg local_ec8;
  SubstituteArg local_e98;
  SubstituteArg local_e68;
  SubstituteArg local_e38;
  SubstituteArg local_e08;
  SubstituteArg local_dd8;
  string local_da8;
  ExtensionRange *local_d88;
  ExtensionRange *range2_2;
  undefined1 local_d78 [4];
  int j_4;
  SubstituteArg local_d48;
  SubstituteArg local_d18;
  SubstituteArg local_ce8;
  SubstituteArg local_cb8;
  SubstituteArg local_c88;
  SubstituteArg local_c58;
  SubstituteArg local_c28;
  SubstituteArg local_bf8;
  SubstituteArg local_bc8;
  string local_b98;
  ReservedRange *local_b78;
  ReservedRange *range2_1;
  ExtensionRange *pEStack_b68;
  int j_3;
  ExtensionRange *range1_1;
  undefined1 local_b58 [4];
  int i_11;
  SubstituteArg local_b28;
  SubstituteArg local_af8;
  SubstituteArg local_ac8;
  SubstituteArg local_a98;
  SubstituteArg local_a68;
  SubstituteArg local_a38;
  SubstituteArg local_a08;
  SubstituteArg local_9d8;
  SubstituteArg local_9a8;
  string local_978;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_958;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_950;
  SubstituteArg local_948;
  SubstituteArg local_918;
  SubstituteArg local_8e8;
  SubstituteArg local_8b8;
  SubstituteArg local_888;
  SubstituteArg local_858;
  SubstituteArg local_828;
  SubstituteArg local_7f8;
  SubstituteArg local_7c8;
  SubstituteArg local_798;
  string local_768;
  ReservedRange *local_748;
  ReservedRange *range_1;
  undefined1 local_738 [4];
  int j_2;
  SubstituteArg local_708;
  SubstituteArg local_6d8;
  SubstituteArg local_6a8;
  SubstituteArg local_678;
  SubstituteArg local_648;
  SubstituteArg local_618;
  SubstituteArg local_5e8;
  SubstituteArg local_5b8;
  SubstituteArg local_588;
  string local_558;
  ExtensionRange *local_538;
  ExtensionRange *range;
  FieldDescriptor *pFStack_528;
  int j_1;
  FieldDescriptor *field;
  undefined1 local_518 [4];
  int i_10;
  SubstituteArg local_4e8;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428;
  SubstituteArg local_3f8;
  SubstituteArg local_3c8;
  SubstituteArg local_398;
  SubstituteArg local_368;
  string local_338;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_318;
  undefined1 local_310;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_308;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_300;
  string *local_2f8;
  string *name;
  undefined1 local_2e8 [4];
  int i_9;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  string local_c0;
  DescriptorProto_ReservedRange *local_a0;
  DescriptorProto_ReservedRange *range2;
  DescriptorProto_ReservedRange *pDStack_90;
  int j;
  DescriptorProto_ReservedRange *range1;
  undefined1 auStack_80 [4];
  int i_8;
  anon_union_8_8_13f84498_for_Symbol_2 local_78;
  int local_6c;
  int local_68;
  int i_7;
  int reserved_name_count;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string *full_name;
  string *scope;
  Descriptor *result_local;
  Descriptor *parent_local;
  DescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  scope = (string *)result;
  result_local = parent;
  parent_local = (Descriptor *)proto;
  proto_local = (DescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    local_f98 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_f98 = Descriptor::full_name_abi_cxx11_(parent);
  }
  full_name = local_f98;
  _i_1 = DescriptorPool::Tables::AllocateString(this->tables_,local_f98);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    std::__cxx11::string::append((ulong)_i_1,'\x01');
  }
  psVar10 = _i_1;
  DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  std::__cxx11::string::append((string *)psVar10);
  psVar10 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar10,_i_1,(Message *)parent_local);
  pTVar1 = this->tables_;
  psVar10 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  psVar10 = DescriptorPool::Tables::AllocateString(pTVar1,psVar10);
  *(string **)scope = psVar10;
  scope->_M_string_length = (size_type)_i_1;
  (scope->field_2)._M_allocated_capacity = (size_type)this->file_;
  *(Descriptor **)((long)&scope->field_2 + 8) = result_local;
  *(undefined1 *)&scope[1]._M_string_length = 0;
  *(undefined1 *)((long)&scope[1]._M_string_length + 1) = 0;
  iVar4 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[1].field_2 + 8) = iVar4;
  iVar4 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::OneofDescriptor>(this,iVar4,(OneofDescriptor **)(scope + 2));
  for (i_2 = 0; iVar4 = i_2,
      iVar5 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      i_2 = i_2 + 1) {
    proto_01 = DescriptorProto::oneof_decl((DescriptorProto *)parent_local,i_2);
    BuildOneof(this,proto_01,(Descriptor *)scope,
               (OneofDescriptor *)(*(long *)(scope + 2) + (long)i_2 * 0x30));
  }
  iVar4 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[1]._M_string_length + 4) = iVar4;
  iVar4 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::FieldDescriptor>
            (this,iVar4,(FieldDescriptor **)&scope[1].field_2._M_allocated_capacity);
  for (i_3 = 0; iVar4 = i_3, iVar5 = DescriptorProto::field_size((DescriptorProto *)parent_local),
      iVar4 < iVar5; i_3 = i_3 + 1) {
    pFVar11 = DescriptorProto::field((DescriptorProto *)parent_local,i_3);
    BuildField(this,pFVar11,(Descriptor *)scope,
               (FieldDescriptor *)(scope[1].field_2._M_allocated_capacity + (long)i_3 * 0xa8));
  }
  iVar4 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
  *(int *)&scope[2]._M_string_length = iVar4;
  iVar4 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::Descriptor>
            (this,iVar4,(Descriptor **)&scope[2].field_2._M_allocated_capacity);
  for (i_4 = 0; iVar4 = i_4,
      iVar5 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      i_4 = i_4 + 1) {
    proto_02 = DescriptorProto::nested_type((DescriptorProto *)parent_local,i_4);
    BuildMessage(this,proto_02,(Descriptor *)scope,
                 (Descriptor *)(scope[2].field_2._M_allocated_capacity + (long)i_4 * 0xa8));
  }
  iVar4 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[2].field_2 + 8) = iVar4;
  iVar4 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::EnumDescriptor>(this,iVar4,(EnumDescriptor **)(scope + 3));
  for (i_5 = 0; iVar4 = i_5,
      iVar5 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      i_5 = i_5 + 1) {
    proto_03 = DescriptorProto::enum_type((DescriptorProto *)parent_local,i_5);
    BuildEnum(this,proto_03,(Descriptor *)scope,
              (EnumDescriptor *)(*(long *)(scope + 3) + (long)i_5 * 0x38));
  }
  iVar4 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  *(int *)&scope[3]._M_string_length = iVar4;
  iVar4 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::Descriptor::ExtensionRange>
            (this,iVar4,(ExtensionRange **)&scope[3].field_2._M_allocated_capacity);
  for (i_6 = 0; iVar4 = i_6,
      iVar5 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      i_6 = i_6 + 1) {
    pDVar12 = DescriptorProto::extension_range((DescriptorProto *)parent_local,i_6);
    BuildExtensionRange(this,pDVar12,(Descriptor *)scope,
                        (ExtensionRange *)(scope[3].field_2._M_allocated_capacity + (long)i_6 * 8));
  }
  iVar4 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[3].field_2 + 8) = iVar4;
  iVar4 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::FieldDescriptor>(this,iVar4,(FieldDescriptor **)(scope + 4));
  for (reserved_name_count = 0; iVar4 = reserved_name_count,
      iVar5 = DescriptorProto::extension_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      reserved_name_count = reserved_name_count + 1) {
    pFVar11 = DescriptorProto::extension((DescriptorProto *)parent_local,reserved_name_count);
    BuildExtension(this,pFVar11,(Descriptor *)scope,
                   (FieldDescriptor *)(*(long *)(scope + 4) + (long)reserved_name_count * 0xa8));
  }
  iVar4 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
  *(int *)&scope[4]._M_string_length = iVar4;
  iVar4 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::Descriptor::ReservedRange>
            (this,iVar4,(ReservedRange **)&scope[4].field_2._M_allocated_capacity);
  for (i_7 = 0; iVar4 = i_7,
      iVar5 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      i_7 = i_7 + 1) {
    pDVar13 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,i_7);
    BuildReservedRange(this,pDVar13,(Descriptor *)scope,
                       (ReservedRange *)(scope[4].field_2._M_allocated_capacity + (long)i_7 * 8));
  }
  local_68 = DescriptorProto::reserved_name_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[4].field_2 + 8) = local_68;
  ppbVar14 = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                       (this->tables_,local_68);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(scope + 5) = ppbVar14;
  for (local_6c = 0; local_6c < local_68; local_6c = local_6c + 1) {
    pTVar1 = this->tables_;
    psVar10 = DescriptorProto::reserved_name_abi_cxx11_((DescriptorProto *)parent_local,local_6c);
    psVar10 = DescriptorPool::Tables::AllocateString(pTVar1,psVar10);
    *(string **)(*(long *)(scope + 5) + (long)local_6c * 8) = psVar10;
  }
  bVar3 = DescriptorProto::has_options((DescriptorProto *)parent_local);
  if (bVar3) {
    orig_options = DescriptorProto::options((DescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::Descriptor>(this,orig_options,(Descriptor *)scope);
  }
  else {
    *(undefined8 *)(scope + 1) = 0;
  }
  psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)scope);
  pDVar2 = result_local;
  psVar15 = Descriptor::name_abi_cxx11_((Descriptor *)scope);
  proto_00 = parent_local;
  Symbol::Symbol((Symbol *)auStack_80,(Descriptor *)scope);
  symbol.field_1.descriptor = local_78.descriptor;
  symbol.type = (Type)auStack_80;
  symbol._4_4_ = i_8;
  AddSymbol(this,psVar10,pDVar2,psVar15,(Message *)proto_00,symbol);
  for (range1._4_4_ = 0; iVar4 = range1._4_4_,
      iVar5 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      range1._4_4_ = range1._4_4_ + 1) {
    pDStack_90 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range1._4_4_);
    range2._4_4_ = range1._4_4_;
    while( true ) {
      range2._4_4_ = range2._4_4_ + 1;
      iVar4 = range2._4_4_;
      iVar5 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
      if (iVar5 <= iVar4) break;
      local_a0 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range2._4_4_);
      iVar6 = DescriptorProto_ReservedRange::end(pDStack_90);
      iVar7 = DescriptorProto_ReservedRange::start(local_a0);
      if (iVar7 < iVar6) {
        iVar6 = DescriptorProto_ReservedRange::end(local_a0);
        iVar7 = DescriptorProto_ReservedRange::start(pDStack_90);
        if (iVar7 < iVar6) {
          psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)scope);
          pDVar13 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range1._4_4_);
          iVar6 = DescriptorProto_ReservedRange::start(local_a0);
          strings::internal::SubstituteArg::SubstituteArg(&local_f0,iVar6);
          iVar6 = DescriptorProto_ReservedRange::end(local_a0);
          strings::internal::SubstituteArg::SubstituteArg(&local_120,iVar6 + -1);
          iVar6 = DescriptorProto_ReservedRange::start(pDStack_90);
          strings::internal::SubstituteArg::SubstituteArg(&local_150,iVar6);
          iVar6 = DescriptorProto_ReservedRange::end(pDStack_90);
          strings::internal::SubstituteArg::SubstituteArg(&local_180,iVar6 + -1);
          strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
          strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
          strings::internal::SubstituteArg::SubstituteArg(&local_210);
          strings::internal::SubstituteArg::SubstituteArg(&local_240);
          strings::internal::SubstituteArg::SubstituteArg(&local_270);
          strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
          strings::Substitute_abi_cxx11_
                    (&local_c0,
                     (strings *)
                     "Reserved range $0 to $1 overlaps with already-defined range $2 to $3.",
                     (char *)&local_f0,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,
                     &local_210,&local_240,&local_270,&local_2a0,in_stack_ffffffffffffee68);
          AddError(this,psVar10,&pDVar13->super_Message,NUMBER,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
    }
  }
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2e8,0);
  for (name._4_4_ = 0; iVar4 = name._4_4_,
      iVar5 = DescriptorProto::reserved_name_size((DescriptorProto *)parent_local), iVar4 < iVar5;
      name._4_4_ = name._4_4_ + 1) {
    local_2f8 = DescriptorProto::reserved_name_abi_cxx11_
                          ((DescriptorProto *)parent_local,name._4_4_);
    local_300._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8,local_2f8);
    local_308._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2e8);
    bVar3 = std::__detail::operator==(&local_300,&local_308);
    pDVar2 = parent_local;
    psVar10 = local_2f8;
    if (bVar3) {
      pVar16 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2e8,local_2f8);
      local_318._M_cur =
           (__node_type *)
           pVar16.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_310 = pVar16.second;
    }
    else {
      strings::internal::SubstituteArg::SubstituteArg(&local_368,local_2f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_398);
      strings::internal::SubstituteArg::SubstituteArg(&local_3c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_3f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_428);
      strings::internal::SubstituteArg::SubstituteArg(&local_458);
      strings::internal::SubstituteArg::SubstituteArg(&local_488);
      strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4e8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_518);
      strings::Substitute_abi_cxx11_
                (&local_338,(strings *)"Field name \"$0\" is reserved multiple times.",
                 (char *)&local_368,&local_398,&local_3c8,&local_3f8,&local_428,&local_458,
                 &local_488,&local_4b8,&local_4e8,(SubstituteArg *)local_518,
                 in_stack_ffffffffffffee68);
      AddError(this,psVar10,(Message *)pDVar2,NAME,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
    }
  }
  for (field._4_4_ = 0; iVar4 = field._4_4_, iVar5 = Descriptor::field_count((Descriptor *)scope),
      iVar4 < iVar5; field._4_4_ = field._4_4_ + 1) {
    pFStack_528 = Descriptor::field((Descriptor *)scope,field._4_4_);
    for (range._4_4_ = 0; iVar4 = range._4_4_,
        iVar5 = Descriptor::extension_range_count((Descriptor *)scope), iVar4 < iVar5;
        range._4_4_ = range._4_4_ + 1) {
      local_538 = Descriptor::extension_range((Descriptor *)scope,range._4_4_);
      iVar4 = local_538->start;
      iVar5 = FieldDescriptor::number(pFStack_528);
      if ((iVar4 <= iVar5) && (iVar4 = FieldDescriptor::number(pFStack_528), iVar4 < local_538->end)
         ) {
        psVar10 = FieldDescriptor::full_name_abi_cxx11_(pFStack_528);
        pDVar12 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range._4_4_);
        strings::internal::SubstituteArg::SubstituteArg(&local_588,local_538->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_5b8,local_538->end + -1);
        psVar15 = FieldDescriptor::name_abi_cxx11_(pFStack_528);
        strings::internal::SubstituteArg::SubstituteArg(&local_5e8,psVar15);
        iVar4 = FieldDescriptor::number(pFStack_528);
        strings::internal::SubstituteArg::SubstituteArg(&local_618,iVar4);
        strings::internal::SubstituteArg::SubstituteArg(&local_648);
        strings::internal::SubstituteArg::SubstituteArg(&local_678);
        strings::internal::SubstituteArg::SubstituteArg(&local_6a8);
        strings::internal::SubstituteArg::SubstituteArg(&local_6d8);
        strings::internal::SubstituteArg::SubstituteArg(&local_708);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_738);
        strings::Substitute_abi_cxx11_
                  (&local_558,(strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                   (char *)&local_588,&local_5b8,&local_5e8,&local_618,&local_648,&local_678,
                   &local_6a8,&local_6d8,&local_708,(SubstituteArg *)local_738,
                   in_stack_ffffffffffffee68);
        AddError(this,psVar10,&pDVar12->super_Message,NUMBER,&local_558);
        std::__cxx11::string::~string((string *)&local_558);
      }
    }
    for (range_1._4_4_ = 0; iVar4 = range_1._4_4_,
        iVar5 = Descriptor::reserved_range_count((Descriptor *)scope), iVar4 < iVar5;
        range_1._4_4_ = range_1._4_4_ + 1) {
      local_748 = Descriptor::reserved_range((Descriptor *)scope,range_1._4_4_);
      iVar4 = local_748->start;
      iVar5 = FieldDescriptor::number(pFStack_528);
      if ((iVar4 <= iVar5) && (iVar4 = FieldDescriptor::number(pFStack_528), iVar4 < local_748->end)
         ) {
        psVar10 = FieldDescriptor::full_name_abi_cxx11_(pFStack_528);
        pDVar13 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range_1._4_4_);
        psVar15 = FieldDescriptor::name_abi_cxx11_(pFStack_528);
        strings::internal::SubstituteArg::SubstituteArg(&local_798,psVar15);
        iVar4 = FieldDescriptor::number(pFStack_528);
        strings::internal::SubstituteArg::SubstituteArg(&local_7c8,iVar4);
        strings::internal::SubstituteArg::SubstituteArg(&local_7f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_828);
        strings::internal::SubstituteArg::SubstituteArg(&local_858);
        strings::internal::SubstituteArg::SubstituteArg(&local_888);
        strings::internal::SubstituteArg::SubstituteArg(&local_8b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_8e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_918);
        strings::internal::SubstituteArg::SubstituteArg(&local_948);
        strings::Substitute_abi_cxx11_
                  (&local_768,(strings *)"Field \"$0\" uses reserved number $1.",(char *)&local_798,
                   &local_7c8,&local_7f8,&local_828,&local_858,&local_888,&local_8b8,&local_8e8,
                   &local_918,&local_948,in_stack_ffffffffffffee68);
        AddError(this,psVar10,&pDVar13->super_Message,NUMBER,&local_768);
        std::__cxx11::string::~string((string *)&local_768);
      }
    }
    psVar10 = FieldDescriptor::name_abi_cxx11_(pFStack_528);
    local_950._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8,psVar10);
    local_958._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2e8);
    bVar3 = std::__detail::operator!=(&local_950,&local_958);
    if (bVar3) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(pFStack_528);
      pFVar11 = DescriptorProto::field((DescriptorProto *)parent_local,field._4_4_);
      psVar15 = FieldDescriptor::name_abi_cxx11_(pFStack_528);
      strings::internal::SubstituteArg::SubstituteArg(&local_9a8,psVar15);
      strings::internal::SubstituteArg::SubstituteArg(&local_9d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_a08);
      strings::internal::SubstituteArg::SubstituteArg(&local_a38);
      strings::internal::SubstituteArg::SubstituteArg(&local_a68);
      strings::internal::SubstituteArg::SubstituteArg(&local_a98);
      strings::internal::SubstituteArg::SubstituteArg(&local_ac8);
      strings::internal::SubstituteArg::SubstituteArg(&local_af8);
      strings::internal::SubstituteArg::SubstituteArg(&local_b28);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_b58);
      strings::Substitute_abi_cxx11_
                (&local_978,(strings *)"Field name \"$0\" is reserved.",(char *)&local_9a8,
                 &local_9d8,&local_a08,&local_a38,&local_a68,&local_a98,&local_ac8,&local_af8,
                 &local_b28,(SubstituteArg *)local_b58,in_stack_ffffffffffffee68);
      AddError(this,psVar10,&pFVar11->super_Message,NAME,&local_978);
      std::__cxx11::string::~string((string *)&local_978);
    }
  }
  for (range1_1._4_4_ = 0; iVar4 = range1_1._4_4_,
      iVar5 = Descriptor::extension_range_count((Descriptor *)scope), iVar4 < iVar5;
      range1_1._4_4_ = range1_1._4_4_ + 1) {
    pEStack_b68 = Descriptor::extension_range((Descriptor *)scope,range1_1._4_4_);
    for (range2_1._4_4_ = 0; iVar5 = range2_1._4_4_,
        iVar8 = Descriptor::reserved_range_count((Descriptor *)scope), iVar4 = range1_1._4_4_,
        iVar5 < iVar8; range2_1._4_4_ = range2_1._4_4_ + 1) {
      local_b78 = Descriptor::reserved_range((Descriptor *)scope,range2_1._4_4_);
      if ((local_b78->start < pEStack_b68->end) && (pEStack_b68->start < local_b78->end)) {
        psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)scope);
        pDVar12 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range1_1._4_4_);
        strings::internal::SubstituteArg::SubstituteArg(&local_bc8,pEStack_b68->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_bf8,pEStack_b68->end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_c28,local_b78->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_c58,local_b78->end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_c88);
        strings::internal::SubstituteArg::SubstituteArg(&local_cb8);
        strings::internal::SubstituteArg::SubstituteArg(&local_ce8);
        strings::internal::SubstituteArg::SubstituteArg(&local_d18);
        strings::internal::SubstituteArg::SubstituteArg(&local_d48);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_d78);
        strings::Substitute_abi_cxx11_
                  (&local_b98,
                   (strings *)"Extension range $0 to $1 overlaps with reserved range $2 to $3.",
                   (char *)&local_bc8,&local_bf8,&local_c28,&local_c58,&local_c88,&local_cb8,
                   &local_ce8,&local_d18,&local_d48,(SubstituteArg *)local_d78,
                   in_stack_ffffffffffffee68);
        AddError(this,psVar10,&pDVar12->super_Message,NUMBER,&local_b98);
        std::__cxx11::string::~string((string *)&local_b98);
      }
    }
    while( true ) {
      range2_2._4_4_ = iVar4 + 1;
      iVar4 = range2_2._4_4_;
      iVar5 = Descriptor::extension_range_count((Descriptor *)scope);
      if (iVar5 <= iVar4) break;
      local_d88 = Descriptor::extension_range((Descriptor *)scope,range2_2._4_4_);
      iVar4 = range2_2._4_4_;
      if ((local_d88->start < pEStack_b68->end) && (pEStack_b68->start < local_d88->end)) {
        psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)scope);
        in_stack_ffffffffffffee68 =
             (SubstituteArg *)
             DescriptorProto::extension_range((DescriptorProto *)parent_local,range1_1._4_4_);
        strings::internal::SubstituteArg::SubstituteArg(&local_dd8,local_d88->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_e08,local_d88->end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_e38,pEStack_b68->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_e68,pEStack_b68->end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_e98);
        strings::internal::SubstituteArg::SubstituteArg(&local_ec8);
        strings::internal::SubstituteArg::SubstituteArg(&local_ef8);
        strings::internal::SubstituteArg::SubstituteArg(&local_f28);
        strings::internal::SubstituteArg::SubstituteArg(&local_f58);
        strings::internal::SubstituteArg::SubstituteArg(&local_f88);
        strings::Substitute_abi_cxx11_
                  (&local_da8,
                   (strings *)
                   "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                   (char *)&local_dd8,&local_e08,&local_e38,&local_e68,&local_e98,&local_ec8,
                   &local_ef8,&local_f28,&local_f58,&local_f88,in_stack_ffffffffffffee68);
        AddError(this,psVar10,(Message *)in_stack_ffffffffffffee68,NUMBER,&local_da8);
        std::__cxx11::string::~string((string *)&local_da8);
        iVar4 = range2_2._4_4_;
      }
    }
  }
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e8);
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl     , BuildOneof         , result);
  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);
  BUILD_ARRAY(proto, result, reserved_range , BuildReservedRange , result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end() - 1,
                                     range1.start(), range1.end() - 1));
      }
    }
  }

  hash_set<string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                 "Field name \"$0\" is reserved multiple times.",
                 name));
    }
  }

  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Field \"$0\" uses reserved number $1.",
                   field->name(), field->number()));
      }
    }
    if (reserved_name_set.find(field->name()) != reserved_name_set.end()) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                 "Field name \"$0\" is reserved.", field->name()));
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "reserved range $2 to $3.",
                                     range1->start, range1->end - 1,
                                     range2->start, range2->end - 1));
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}